

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMerge.c
# Opt level: O3

Cut_Cut_t * Cut_CutMergeTwo(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Cut_Cut_t *pCVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar10 = *(uint *)pCut0;
  uVar11 = uVar10 >> 0x1c;
  uVar12 = *(uint *)pCut1 >> 0x1c;
  if (uVar11 < uVar12) {
    __assert_fail("pCut0->nLeaves >= pCut1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutMerge.c"
                  ,0xb1,"Cut_Cut_t *Cut_CutMergeTwo(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  uVar9 = p->pParams->nVarsMax;
  if (uVar12 == uVar9 && uVar11 == uVar9) {
    if (uVar10 < 0x10000000) {
      pCVar4 = Cut_CutAlloc(p);
    }
    else {
      uVar5 = 0;
      do {
        if (*(int *)(&pCut0[1].field_0x0 + uVar5 * 4) != *(int *)(&pCut1[1].field_0x0 + uVar5 * 4))
        {
          return (Cut_Cut_t *)0x0;
        }
        uVar5 = uVar5 + 1;
      } while (uVar11 != uVar5);
      pCVar4 = Cut_CutAlloc(p);
      if (0xfffffff < uVar10) {
        uVar5 = 0;
        do {
          *(undefined4 *)(&pCVar4[1].field_0x0 + uVar5 * 4) =
               *(undefined4 *)(&pCut0[1].field_0x0 + uVar5 * 4);
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
      }
    }
  }
  else {
    if (uVar11 != uVar9) {
      pCVar4 = p->pReady;
      if (pCVar4 == (Cut_Cut_t *)0x0) {
        pCVar4 = Cut_CutAlloc(p);
        p->pReady = pCVar4;
      }
      if ((int)uVar9 < 1) {
        uVar6 = 0;
        uVar10 = 0;
        uVar9 = 0;
      }
      else {
        iVar3 = 0;
        uVar5 = 0;
        uVar10 = 0;
        uVar6 = 0;
        do {
          if (uVar10 == uVar12) {
            if (uVar6 == uVar11) {
              *(uint *)pCVar4 = (*(uint *)pCVar4 & 0xfffffff) - iVar3;
              goto LAB_008ceca7;
            }
            *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) =
                 *(uint *)(&pCut0[1].field_0x0 + (long)(int)uVar6 * 4);
            uVar10 = uVar12;
            uVar6 = uVar6 + 1;
          }
          else if (uVar6 == uVar11) {
            lVar7 = (long)(int)uVar10;
            uVar10 = uVar10 + 1;
            *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) =
                 *(uint *)(&pCut1[1].field_0x0 + lVar7 * 4);
            uVar6 = uVar11;
          }
          else {
            uVar1 = *(uint *)(&pCut0[1].field_0x0 + (long)(int)uVar6 * 4);
            uVar2 = *(uint *)(&pCut1[1].field_0x0 + (long)(int)uVar10 * 4);
            if ((int)uVar1 < (int)uVar2) {
              uVar6 = uVar6 + 1;
              *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) = uVar1;
            }
            else if ((int)uVar2 < (int)uVar1) {
              uVar10 = uVar10 + 1;
              *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) = uVar2;
            }
            else {
              uVar6 = uVar6 + 1;
              *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) = uVar1;
              uVar10 = uVar10 + 1;
            }
          }
          uVar5 = uVar5 + 1;
          iVar3 = iVar3 + -0x10000000;
        } while (uVar9 != uVar5);
        uVar9 = uVar9 << 0x1c;
      }
      if ((int)uVar6 < (int)uVar11) {
        return (Cut_Cut_t *)0x0;
      }
      if ((int)uVar10 < (int)uVar12) {
        return (Cut_Cut_t *)0x0;
      }
      *(uint *)pCVar4 = *(uint *)pCVar4 & 0xfffffff | uVar9;
LAB_008ceca7:
      pCVar4 = p->pReady;
      p->pReady = (Cut_Cut_t *)0x0;
      return pCVar4;
    }
    if (0xfffffff < *(uint *)pCut1) {
      uVar8 = 0;
      uVar5 = (ulong)(uVar10 >> 0x1c);
      do {
        if ((long)uVar5 < 1) {
          return (Cut_Cut_t *)0x0;
        }
        lVar7 = uVar5 * 4;
        uVar5 = uVar5 - 1;
      } while ((*(int *)((long)&pCut0->pNext + lVar7 + 4) !=
                *(int *)(&pCut1[1].field_0x0 + uVar8 * 4)) ||
              (uVar8 = uVar8 + 1, uVar5 = (ulong)(uVar10 >> 0x1c), uVar8 != uVar12));
    }
    pCVar4 = Cut_CutAlloc(p);
    if (0xfffffff < uVar10) {
      uVar5 = 0;
      do {
        *(undefined4 *)(&pCVar4[1].field_0x0 + uVar5 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + uVar5 * 4);
        uVar5 = uVar5 + 1;
      } while (uVar11 != uVar5);
    }
  }
  *(uint *)pCVar4 = *(uint *)pCVar4 & 0xfffffff | *(uint *)pCut0 & 0xf0000000;
  return pCVar4;
}

Assistant:

Cut_Cut_t * Cut_CutMergeTwo( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{ 
    Cut_Cut_t * pRes;
    int * pLeaves;
    int Limit, nLeaves0, nLeaves1;
    int i, k, c;

    assert( pCut0->nLeaves >= pCut1->nLeaves );

    // consider two cuts
    nLeaves0 = pCut0->nLeaves;
    nLeaves1 = pCut1->nLeaves;

    // the case of the largest cut sizes
    Limit = p->pParams->nVarsMax;
    if ( nLeaves0 == Limit && nLeaves1 == Limit )
    {
        for ( i = 0; i < nLeaves0; i++ )
            if ( pCut0->pLeaves[i] != pCut1->pLeaves[i] )
                return NULL;
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = pCut0->nLeaves;
        return pRes;
    }
    // the case when one of the cuts is the largest
    if ( nLeaves0 == Limit )
    {
        for ( i = 0; i < nLeaves1; i++ )
        {
            for ( k = nLeaves0 - 1; k >= 0; k-- )
                if ( pCut0->pLeaves[k] == pCut1->pLeaves[i] )
                    break;
            if ( k == -1 ) // did not find
                return NULL;
        }
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = pCut0->nLeaves;
        return pRes;
    }

    // prepare the cut
    if ( p->pReady == NULL )
        p->pReady = Cut_CutAlloc( p );
    pLeaves = p->pReady->pLeaves;

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < Limit; c++ )
    {
        if ( k == nLeaves1 )
        {
            if ( i == nLeaves0 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( i == nLeaves0 )
        {
            if ( k == nLeaves1 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        if ( pCut0->pLeaves[i] < pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( pCut0->pLeaves[i] > pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        pLeaves[c] = pCut0->pLeaves[i++]; 
        k++;
    }
    if ( i < nLeaves0 || k < nLeaves1 )
        return NULL;
    p->pReady->nLeaves = c;
    pRes = p->pReady;  p->pReady = NULL;
    return pRes;
}